

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetSpecifics
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  pointer pcVar1;
  pointer pcVar2;
  string *psVar3;
  ostream *poVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string outpath;
  string binpath;
  char *local_f0;
  char *local_e8;
  char local_e0;
  undefined7 uStack_df;
  long *local_d0;
  undefined8 local_c8;
  long local_c0 [2];
  string local_b0;
  string local_90;
  string local_60;
  undefined8 local_40;
  long *local_38;
  
  local_f0 = &local_e0;
  local_e8 = (char *)0x0;
  local_e0 = '\0';
  if (this->TagType != SUBPROJECT) {
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalGenerator);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    pcVar2 = (pointer)psVar3->_M_string_length;
    local_90._M_dataplus._M_p = &DAT_00000001;
    local_90.field_2._M_local_buf[0] = '/';
    local_90._M_string_length = (size_type)&local_90.field_2;
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
              (&local_d0,this->LocalGenerator,this->GeneratorTarget);
    local_60.field_2._M_allocated_capacity = (size_type)local_90._M_dataplus._M_p;
    local_60.field_2._8_8_ = local_90._M_string_length;
    local_40 = local_c8;
    local_38 = local_d0;
    views._M_len = 3;
    views._M_array = (iterator)&local_60;
    local_60._M_dataplus._M_p = pcVar2;
    local_60._M_string_length = (size_type)pcVar1;
    cmCatViews_abi_cxx11_(&local_b0,views);
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
    cmGeneratorTarget::GetDirectory(&local_90,this->GeneratorTarget,config,RuntimeBinaryArtifact);
    cmSystemTools::RelativePath(&local_60,&local_b0,&local_90);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,(ulong)(local_60.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(fout,"    :binDirRelative=\"",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_f0,(long)local_e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n    -o \"",10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->TargetNameReal)._M_dataplus._M_p,
                        (this->TargetNameReal)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::_M_replace((ulong)&local_f0,0,local_e8,0x7667f0);
  std::__ostream_insert<char,std::char_traits<char>>(fout,"    :outputDirRelative=\"",0x18);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_f0,(long)local_e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetSpecifics(std::ostream& fout,
                                                     const std::string& config)
{
  std::string outpath;

  /* Determine paths from the target project file to where the output artifacts
   * need to be located.
   */
  if (this->TagType != GhsMultiGpj::SUBPROJECT) {
    // set target binary file destination
    std::string binpath = cmStrCat(
      this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
      this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
    outpath = cmSystemTools::RelativePath(
      binpath, this->GeneratorTarget->GetDirectory(config));
    /* clang-format off */
    fout << "    :binDirRelative=\"" << outpath << "\"\n"
            "    -o \"" << this->TargetNameReal << "\"\n";
    /* clang-format on */
  }

  // set target object file destination
  outpath = ".";
  fout << "    :outputDirRelative=\"" << outpath << "\"\n";
}